

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Optimizer::MergeFrom(Optimizer *this,Optimizer *from)

{
  void *pvVar1;
  LogMessage *other;
  AdamOptimizer *this_00;
  SGDOptimizer *this_01;
  AdamOptimizer *from_00;
  SGDOptimizer *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x1228c);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->_oneof_case_[0] != 10) {
    if (from->_oneof_case_[0] != 0xb) {
      return;
    }
    if (this->_oneof_case_[0] == 0xb) {
      this_00 = (this->OptimizerType_).adamoptimizer_;
    }
    else {
      clear_OptimizerType(this);
      this->_oneof_case_[0] = 0xb;
      this_00 = (AdamOptimizer *)operator_new(0x40);
      AdamOptimizer::AdamOptimizer(this_00);
      (this->OptimizerType_).adamoptimizer_ = this_00;
      if (from->_oneof_case_[0] != 0xb) {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_00 = (AdamOptimizer *)&_AdamOptimizer_default_instance_;
        goto LAB_002366e2;
      }
    }
    from_00 = (from->OptimizerType_).adamoptimizer_;
LAB_002366e2:
    AdamOptimizer::MergeFrom(this_00,from_00);
    return;
  }
  if (this->_oneof_case_[0] == 10) {
    this_01 = (this->OptimizerType_).sgdoptimizer_;
  }
  else {
    clear_OptimizerType(this);
    this->_oneof_case_[0] = 10;
    this_01 = (SGDOptimizer *)operator_new(0x30);
    SGDOptimizer::SGDOptimizer(this_01);
    (this->OptimizerType_).sgdoptimizer_ = this_01;
    if (from->_oneof_case_[0] != 10) {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (SGDOptimizer *)&_SGDOptimizer_default_instance_;
      goto LAB_002366f8;
    }
  }
  from_01 = (from->OptimizerType_).sgdoptimizer_;
LAB_002366f8:
  SGDOptimizer::MergeFrom(this_01,from_01);
  return;
}

Assistant:

void Optimizer::MergeFrom(const Optimizer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Optimizer)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.OptimizerType_case()) {
    case kSgdOptimizer: {
      mutable_sgdoptimizer()->::CoreML::Specification::SGDOptimizer::MergeFrom(from.sgdoptimizer());
      break;
    }
    case kAdamOptimizer: {
      mutable_adamoptimizer()->::CoreML::Specification::AdamOptimizer::MergeFrom(from.adamoptimizer());
      break;
    }
    case OPTIMIZERTYPE_NOT_SET: {
      break;
    }
  }
}